

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>
          (AssertionExpr *this,MonitorVisitor *visitor)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  MonitorVisitor *local_18;
  MonitorVisitor *visitor_local;
  AssertionExpr *this_local;
  
  local_18 = visitor;
  visitor_local = (MonitorVisitor *)this;
  switch(this->kind) {
  case Invalid:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visitInvalid
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,this);
    break;
  case Simple:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::SimpleAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (SimpleAssertionExpr *)this);
    break;
  case SequenceConcat:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::SequenceConcatExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (SequenceConcatExpr *)this);
    break;
  case SequenceWithMatch:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::SequenceWithMatchExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (SequenceWithMatchExpr *)this);
    break;
  case Unary:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::UnaryAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (UnaryAssertionExpr *)this);
    break;
  case Binary:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::BinaryAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (BinaryAssertionExpr *)this);
    break;
  case FirstMatch:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::FirstMatchAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (FirstMatchAssertionExpr *)this);
    break;
  case Clocking:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ClockingAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ClockingAssertionExpr *)this);
    break;
  case StrongWeak:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::StrongWeakAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (StrongWeakAssertionExpr *)this);
    break;
  case Abort:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::AbortAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (AbortAssertionExpr *)this);
    break;
  case Conditional:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ConditionalAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ConditionalAssertionExpr *)this);
    break;
  case Case:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::CaseAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (CaseAssertionExpr *)this);
    break;
  case DisableIff:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::DisableIffAssertionExpr>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (DisableIffAssertionExpr *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x199);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case AssertionExprKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}